

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1Convolve2DHighbdIntraBCTest_DISABLED_SpeedTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1Convolve2DHighbdIntraBCTest_DISABLED_SpeedTest_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::TestParam<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,ConvolveParams*,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x1cb80);
  Test::Test(this_00);
  *(undefined4 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_0104d628;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__AV1Convolve2DHighbdIntraBCTest_DISABLED_SpeedTest_Test_0104d668;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }